

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindTest.cpp
# Opt level: O0

bool blc::network::isPortFree(int port)

{
  int __fd;
  int iVar1;
  uint16_t in_DI;
  int sock;
  sockaddr_in addr;
  sockaddr local_18;
  uint16_t local_8;
  
  local_8 = in_DI;
  __fd = socket(2,1,0);
  local_18.sa_family = 2;
  local_18.sa_data._0_2_ = htons(local_8);
  local_18.sa_data._2_4_ = htonl(0);
  iVar1 = bind(__fd,&local_18,0x10);
  if (iVar1 != -1) {
    close(__fd);
  }
  else {
    close(__fd);
  }
  return iVar1 != -1;
}

Assistant:

bool blc::network::isPortFree(int port) {
	struct ::sockaddr_in addr;
		int sock = socket(PF_INET, SOCK_STREAM, 0);
		addr.sin_family = AF_INET;
		addr.sin_port = htons(port);
		addr.sin_addr.s_addr = htonl(INADDR_ANY);
		if (::bind(sock, (const struct sockaddr *)&addr, sizeof(struct sockaddr_in)) == -1) {
			close(sock);
			return (false);
		}
		close(sock);
		return (true);
}